

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_test.cpp
# Opt level: O2

void __thiscall TimeAlloc::~TimeAlloc(TimeAlloc *this)

{
  ostream *poVar1;
  
  time((time_t *)0x0);
  poVar1 = std::operator<<((ostream *)&std::cout,"time, ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"cnt, ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,globalCnt);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

~TimeAlloc()
	{
		time_t endTime = time(NULL);
		cout << "time, " << (unsigned int)(endTime - m_startTime) << endl;
		cout << "cnt, " << globalCnt << endl;
	}